

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixRandomness(sqlite3_vfs *NotUsed,int nBuf,char *zBuf)

{
  int *piVar1;
  bool bVar2;
  time_t local_30;
  time_t t;
  int got;
  int fd;
  char *zBuf_local;
  sqlite3_vfs *psStack_10;
  int nBuf_local;
  sqlite3_vfs *NotUsed_local;
  
  _got = (time_t *)zBuf;
  zBuf_local._4_4_ = nBuf;
  psStack_10 = NotUsed;
  memset(zBuf,0,(long)nBuf);
  randomnessPid = getpid();
  t._4_4_ = robust_open("/dev/urandom",0,0);
  if ((int)t._4_4_ < 0) {
    time(&local_30);
    *_got = local_30;
    *(pid_t *)(_got + 1) = randomnessPid;
    zBuf_local._4_4_ = 0xc;
  }
  else {
    do {
      t._0_4_ = (*aSyscall[8].pCurrent)((ulong)t._4_4_,_got,(long)zBuf_local._4_4_);
      bVar2 = false;
      if ((int)t < 0) {
        piVar1 = __errno_location();
        bVar2 = *piVar1 == 4;
      }
    } while (bVar2);
    robust_close((unixFile *)0x0,t._4_4_,0x9836);
  }
  return zBuf_local._4_4_;
}

Assistant:

static int unixRandomness(sqlite3_vfs *NotUsed, int nBuf, char *zBuf){
  UNUSED_PARAMETER(NotUsed);
  assert((size_t)nBuf>=(sizeof(time_t)+sizeof(int)));

  /* We have to initialize zBuf to prevent valgrind from reporting
  ** errors.  The reports issued by valgrind are incorrect - we would
  ** prefer that the randomness be increased by making use of the
  ** uninitialized space in zBuf - but valgrind errors tend to worry
  ** some users.  Rather than argue, it seems easier just to initialize
  ** the whole array and silence valgrind, even if that means less randomness
  ** in the random seed.
  **
  ** When testing, initializing zBuf[] to zero is all we do.  That means
  ** that we always use the same random number sequence.  This makes the
  ** tests repeatable.
  */
  memset(zBuf, 0, nBuf);
  randomnessPid = osGetpid(0);  
#if !defined(SQLITE_TEST) && !defined(SQLITE_OMIT_RANDOMNESS)
  {
    int fd, got;
    fd = robust_open("/dev/urandom", O_RDONLY, 0);
    if( fd<0 ){
      time_t t;
      time(&t);
      memcpy(zBuf, &t, sizeof(t));
      memcpy(&zBuf[sizeof(t)], &randomnessPid, sizeof(randomnessPid));
      assert( sizeof(t)+sizeof(randomnessPid)<=(size_t)nBuf );
      nBuf = sizeof(t) + sizeof(randomnessPid);
    }else{
      do{ got = osRead(fd, zBuf, nBuf); }while( got<0 && errno==EINTR );
      robust_close(0, fd, __LINE__);
    }
  }
#endif
  return nBuf;
}